

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_format_proto3.pb.cc
# Opt level: O2

size_t __thiscall proto3::StringtoInt::ByteSizeLong(StringtoInt *this)

{
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  const_iterator __begin2;
  UntypedMapIterator local_30;
  
  uVar1 = _internal_map_size(this);
  sVar3 = (size_t)uVar1;
  google::protobuf::internal::MapFieldBase::SyncMapWithRepeatedField
            ((MapFieldBase *)&(this->field_0)._impl_);
  google::protobuf::internal::UntypedMapBase::begin
            (&local_30,
             (UntypedMapBase *)
             &(this->field_0)._impl_.map_.
              super_TypeDefinedMapFieldBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
              .field_0.map_);
  while (local_30.node_ != (NodeBase *)0x0) {
    sVar2 = google::protobuf::internal::
            MapEntryFuncs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)5>
            ::ByteSizeLong((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_30.node_ + 1),(int *)(local_30.node_ + 5));
    sVar3 = sVar3 + sVar2;
    google::protobuf::internal::UntypedMapIterator::PlusPlus(&local_30);
  }
  sVar3 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar3,&(this->field_0)._impl_._cached_size_);
  return sVar3;
}

Assistant:

::size_t StringtoInt::ByteSizeLong() const {
  const StringtoInt& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto3.StringtoInt)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // map<string, int32> map = 1;
    {
      total_size +=
          1 * ::google::protobuf::internal::FromIntSize(this_._internal_map_size());
      for (const auto& entry : this_._internal_map()) {
        total_size += _pbi::MapEntryFuncs<std::string, ::int32_t,
                                       _pbi::WireFormatLite::TYPE_STRING,
                                       _pbi::WireFormatLite::TYPE_INT32>::ByteSizeLong(entry.first, entry.second);
      }
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}